

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O1

size_t count_images(aiScene *scene)

{
  char *__s;
  aiMaterial *pMat;
  size_type sVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  uint index;
  long lVar5;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  images;
  aiString texpath;
  long *local_4a8 [2];
  long local_498 [2];
  aiScene *local_488;
  ulong local_480;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_478;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_470;
  aiString local_434;
  
  local_470._M_buckets = &local_470._M_single_bucket;
  local_470._M_bucket_count = 1;
  local_470._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_470._M_element_count = 0;
  local_470._M_rehash_policy._M_max_load_factor = 1.0;
  local_470._M_rehash_policy._M_next_resize = 0;
  local_470._M_single_bucket = (__node_base_ptr)0x0;
  local_434.length = 0;
  local_434.data[0] = '\0';
  memset(local_434.data + 1,0x1b,0x3ff);
  if (scene->mNumMaterials != 0) {
    __s = local_434.data;
    uVar4 = 0;
    local_488 = scene;
    do {
      pMat = local_488->mMaterials[uVar4];
      lVar5 = 1;
      local_480 = uVar4;
      do {
        uVar2 = aiGetMaterialTextureCount(pMat,(aiTextureType)lVar5);
        if (uVar2 != 0) {
          index = 0;
          do {
            aiGetMaterialTexture
                      (pMat,(aiTextureType)lVar5,index,&local_434,(aiTextureMapping *)0x0,
                       (uint *)0x0,(ai_real *)0x0,(aiTextureOp *)0x0,(aiTextureMapMode *)0x0,
                       (uint *)0x0);
            local_4a8[0] = local_498;
            sVar3 = strlen(__s);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,__s,__s + sVar3);
            local_478 = &local_470;
            std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_478,(string *)local_4a8,&local_478);
            if (local_4a8[0] != local_498) {
              operator_delete(local_4a8[0],local_498[0] + 1);
            }
            index = index + 1;
          } while (uVar2 != index);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x12);
      uVar4 = local_480 + 1;
    } while (uVar4 < local_488->mNumMaterials);
  }
  sVar1 = local_470._M_element_count;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_470);
  return sVar1;
}

Assistant:

size_t count_images(const aiScene* scene) {
    std::unordered_set<std::string> images;
    aiString texpath;
    for (size_t i = 0; i < scene->mNumMaterials; ++i) {
        aiMaterial* mat = scene->mMaterials[i];
        for (
            size_t tt = aiTextureType_DIFFUSE;
            tt < aiTextureType_UNKNOWN;
            ++tt
        ){
            const aiTextureType textype = static_cast<aiTextureType>(tt);
            const size_t texcount = mat->GetTextureCount(textype);
            for (unsigned int j = 0; j < texcount; ++j) {
                mat->GetTexture(textype, j, &texpath);
                images.insert(std::string(texpath.C_Str()));
            }
        }
    }
    return images.size();
}